

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O3

int ExactFloat::NumSignificantDigitsForPrec(int prec)

{
  double dVar1;
  
  dVar1 = ceil((double)prec * 0.30102999566398114);
  return (int)(dVar1 + 1.0);
}

Assistant:

int ExactFloat::NumSignificantDigitsForPrec(int prec) {
  // The simplest bound is
  //
  //    d <= 1 + ceil(prec * log10(2))
  //
  // The following bound is tighter by 0.5 digits on average, but requires
  // the exponent to be known as well:
  //
  //    d <= ceil(exp * log10(2)) - floor((exp - prec) * log10(2))
  //
  // Since either of these bounds can be too large by 0, 1, or 2 digits, we
  // stick with the simpler first bound.
  return static_cast<int>(1 + ceil(prec * (M_LN2 / M_LN10)));
}